

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_functional_common.hxx
# Opt level: O1

void __thiscall raft_functional_common::TestMgr::save_config(TestMgr *this,cluster_config *config)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  ptr<buffer> buf;
  undefined1 local_38 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  nuraft::cluster_config::serialize((cluster_config *)(local_38 + 0x18));
  nuraft::cluster_config::deserialize((cluster_config *)local_38,(buffer *)local_38._24_8_);
  uVar2 = local_38._8_8_;
  uVar1 = local_38._0_8_;
  local_38._0_8_ = 0;
  local_38._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->savedConfig).
            super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  (this->savedConfig).super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)uVar1;
  (this->savedConfig).super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return;
}

Assistant:

void save_config(const cluster_config& config) {
        ptr<buffer> buf = config.serialize();
        savedConfig = cluster_config::deserialize(*buf);
    }